

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

var __thiscall cs::function::call_rr(function *this,function *_this,vector *args)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer paVar2;
  _Elt_pointer ppsVar3;
  element_type *peVar4;
  var *pvVar5;
  element_type *peVar6;
  runtime_error *this_00;
  size_t i;
  ulong uVar7;
  _Elt_pointer ppsVar8;
  _Elt_pointer ppsVar9;
  long lVar10;
  long lVar11;
  _Map_pointer pppsVar12;
  fcall_guard fcall;
  scope_guard scope;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [4];
  string local_70;
  string local_50;
  
  process_context::poll_event((process_context *)current_process);
  if ((long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 !=
      (long)(_this->mArgs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(_this->mArgs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 5) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::to_string
              (&local_50,
               (long)(_this->mArgs).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(_this->mArgs).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    std::operator+(local_f0,"Wrong size of arguments. Expected ",&local_50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fcall,
                   local_f0,", provided ");
    std::__cxx11::to_string
              (&local_70,
               (long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                     .super__Vector_impl_data._M_start >> 3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&scope,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fcall,
                   &local_70);
    runtime_error::runtime_error(this_00,(string *)&scope);
    __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  scope_guard::scope_guard(&scope,&_this->mContext);
  fcall_guard::fcall_guard(&fcall);
  lVar11 = 0;
  lVar10 = 0;
  for (uVar7 = 0;
      paVar2 = (args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar7 < (ulong)((long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)paVar2 >> 3);
      uVar7 = uVar7 + 1) {
    domain_manager::add_var_no_return<std::__cxx11::string_const&>
              (&(((((_this->mContext).
                    super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->super_runtime_type).storage,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(((_this->mArgs).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar11),
               (var *)((long)&paVar2->mDat + lVar10));
    lVar10 = lVar10 + 8;
    lVar11 = lVar11 + 0x20;
  }
  ppsVar9 = (_this->mBody).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppsVar8 = (_this->mBody).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_last;
  pppsVar12 = (_this->mBody).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_node;
  ppsVar3 = (_this->mBody).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  do {
    if (ppsVar9 == ppsVar3) {
      pvVar5 = fcall_guard::get(&fcall);
LAB_002eba50:
      peVar6 = (element_type *)pvVar5->mDat;
      if (peVar6 == (element_type *)0x0) {
        peVar6 = (element_type *)0x0;
      }
      else {
        p_Var1 = &(peVar6->compiler).
                  super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        p_Var1->_M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&p_Var1->_M_pi->_vptr__Sp_counted_base + 1);
      }
      (this->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar6;
      fcall_guard::~fcall_guard(&fcall);
      scope_guard::~scope_guard(&scope);
      return (var)(proxy *)this;
    }
    statement_base::run(*ppsVar9);
    peVar4 = (((_this->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar4->return_fcall == true) {
      peVar4->return_fcall = false;
      pvVar5 = fcall_guard::get(&fcall);
      goto LAB_002eba50;
    }
    ppsVar9 = ppsVar9 + 1;
    if (ppsVar9 == ppsVar8) {
      ppsVar9 = pppsVar12[1];
      pppsVar12 = pppsVar12 + 1;
      ppsVar8 = ppsVar9 + 0x40;
    }
  } while( true );
}

Assistant:

var function::call_rr(const function *_this, vector &args)
	{
		current_process->poll_event();
		if (args.size() != _this->mArgs.size())
			throw runtime_error(
			    "Wrong size of arguments. Expected " + std::to_string(_this->mArgs.size()) + ", provided " +
			    std::to_string(args.size()));
		scope_guard scope(_this->mContext);
#ifdef CS_DEBUGGER
		fcall_guard fcall(_this->mDecl);
		if(_this->mMatch)
			cs_debugger_func_callback(_this->mDecl, _this->mStmt);
#else
		fcall_guard fcall;
#endif
		for (std::size_t i = 0; i < args.size(); ++i)
			_this->mContext->instance->storage.add_var_no_return(_this->mArgs[i], args[i]);
		for (auto &ptr: _this->mBody) {
			try {
				ptr->run();
			}
			catch (const cs::exception &e) {
				throw e;
			}
			catch (const std::exception &e) {
				throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
			}
			if (_this->mContext->instance->return_fcall) {
				_this->mContext->instance->return_fcall = false;
				return fcall.get();
			}
		}
		return fcall.get();
	}